

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall wasm::Wasm2JSBuilder::addGlobalImport(Wasm2JSBuilder *this,Ref ast,Global *import)

{
  Ref r;
  Ref RVar1;
  Ref in_R8;
  IString IVar2;
  IString name;
  
  ensureModuleVar(this,ast,&import->super_Importable);
  r = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,r);
  RVar1 = getImportName(this,&import->super_Importable);
  if ((import->type).id == 2) {
    RVar1.inst = (Value *)makeJsCoercion(RVar1,JS_INT);
  }
  IVar2 = fromName(this,(import->super_Importable).super_Named.name.super_IString.str,Top);
  name.str._M_len = IVar2.str._M_str;
  name.str._M_str = (char *)RVar1.inst;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)r.inst,(Value *)IVar2.str._M_len,name,in_R8);
  return;
}

Assistant:

void Wasm2JSBuilder::addGlobalImport(Ref ast, Global* import) {
  ensureModuleVar(ast, *import);
  Ref theVar = ValueBuilder::makeVar();
  ast->push_back(theVar);
  Ref value = getImportName(*import);
  if (import->type == Type::i32) {
    value = makeJsCoercion(value, JS_INT);
  }
  ValueBuilder::appendToVar(
    theVar, fromName(import->name, NameScope::Top), value);
}